

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Preferences::Node::deleteAllEntries(Node *this)

{
  Entry **ppEVar1;
  void *pvVar2;
  Entry *__ptr;
  int i;
  long lVar3;
  long lVar4;
  
  __ptr = this->entry_;
  if (__ptr != (Entry *)0x0) {
    ppEVar1 = &this->entry_;
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < this->nEntry_; lVar3 = lVar3 + 1) {
      pvVar2 = *(void **)((long)&__ptr->name + lVar4);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        __ptr = *ppEVar1;
        *(undefined8 *)((long)&__ptr->name + lVar4) = 0;
      }
      pvVar2 = *(void **)((long)&__ptr->value + lVar4);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        __ptr = *ppEVar1;
        *(undefined8 *)((long)&__ptr->value + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x10;
    }
    free(__ptr);
    *ppEVar1 = (Entry *)0x0;
    this->nEntry_ = 0;
    this->NEntry_ = 0;
  }
  this->field_0x30 = this->field_0x30 | 1;
  return;
}

Assistant:

void Fl_Preferences::Node::deleteAllEntries() {
  if ( entry_ ) {
    for ( int i = 0; i < nEntry_; i++ ) {
      if ( entry_[i].name ) {
	free( entry_[i].name );
	entry_[i].name = 0L;
      }
      if ( entry_[i].value ) {
	free( entry_[i].value );
	entry_[i].value = 0L;
      }
    }
    free( entry_ );
    entry_ = 0L;
    nEntry_ = 0;
    NEntry_ = 0;
  }
  dirty_ = 1;
}